

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O1

char * __thiscall asmjit::Zone::sformat(Zone *this,char *fmt,...)

{
  char in_AL;
  int iVar1;
  char *pcVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char buf [512];
  undefined8 local_2e8;
  void **local_2e0;
  undefined1 *local_2d8;
  undefined1 local_2c8 [16];
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_288;
  undefined8 local_278;
  undefined8 local_268;
  undefined8 local_258;
  undefined8 local_248;
  undefined8 local_238;
  undefined8 local_228;
  char local_218 [520];
  undefined4 extraout_var;
  
  if (in_AL != '\0') {
    local_298 = in_XMM0_Qa;
    local_288 = in_XMM1_Qa;
    local_278 = in_XMM2_Qa;
    local_268 = in_XMM3_Qa;
    local_258 = in_XMM4_Qa;
    local_248 = in_XMM5_Qa;
    local_238 = in_XMM6_Qa;
    local_228 = in_XMM7_Qa;
  }
  if (fmt == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    local_2d8 = local_2c8;
    local_2e0 = &ap[0].overflow_arg_area;
    local_2e8 = 0x3000000010;
    local_2b8 = in_RDX;
    local_2b0 = in_RCX;
    local_2a8 = in_R8;
    local_2a0 = in_R9;
    iVar1 = vsnprintf(local_218,0x1ff,fmt,&local_2e8);
    local_218[iVar1] = '\0';
    iVar1 = dup(this,(int)local_218);
    pcVar2 = (char *)CONCAT44(extraout_var,iVar1);
  }
  return pcVar2;
}

Assistant:

char* Zone::sformat(const char* fmt, ...) noexcept {
  if (ASMJIT_UNLIKELY(!fmt)) return nullptr;

  char buf[512];
  size_t len;

  va_list ap;
  va_start(ap, fmt);

  len = vsnprintf(buf, ASMJIT_ARRAY_SIZE(buf) - 1, fmt, ap);
  buf[len++] = 0;

  va_end(ap);
  return static_cast<char*>(dup(buf, len));
}